

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LL.cpp
# Opt level: O1

void __thiscall ll_grammar::GrammarLeft::GrammarLeft(GrammarLeft *this,string *generate,int length)

{
  _Rb_tree_header *p_Var1;
  vector<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_> *pvVar2;
  long lVar3;
  long *plVar4;
  pointer pcVar5;
  pointer pvVar6;
  vector<int,_std::allocator<int>_> *this_00;
  iterator __position;
  int iVar7;
  pointer pbVar8;
  ulong uVar9;
  pointer pEVar10;
  ostream *poVar11;
  pointer piVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  string finnalyC;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result_of_name;
  int index;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  vectorGenrates;
  undefined1 local_1f8 [32];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_1d8;
  ulong local_1d0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_1c8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_178;
  ulong local_158;
  ulong local_150;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  Express local_48;
  
  p_Var1 = &(this->name_of_keys)._M_t._M_impl.super__Rb_tree_header;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  pvVar2 = &this->elements;
  local_1c0 = &this->first;
  local_1d8 = &this->follow;
  local_1c8 = &this->predict_table;
  memset(&(this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0xb0);
  local_178.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d0 = (ulong)(uint)length;
  if (0 < length) {
    lVar16 = local_1d0 << 5;
    lVar14 = 0;
    do {
      local_1f8._0_8_ = (pointer)0x0;
      local_1f8._8_8_ = (pointer)0x0;
      local_1f8._16_8_ = (pointer)0x0;
      lVar3 = *(long *)((long)&(generate->_M_dataplus)._M_p + lVar14);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,lVar3,
                 *(long *)((long)&generate->_M_string_length + lVar14) + lVar3);
      public_tool::parse_productions
                (&local_68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::push_back(&local_178,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1f8);
      lVar14 = lVar14 + 0x20;
    } while (lVar16 != lVar14);
  }
  if (0 < length) {
    lVar14 = local_1d0 * 0x18;
    lVar16 = 0;
    do {
      plVar4 = *(long **)((long)&((local_178.
                                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar16);
      lVar3 = *plVar4;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_88,lVar3,plVar4[1] + lVar3);
      add_element(this,&local_88,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      lVar16 = lVar16 + 0x18;
    } while (lVar14 != lVar16);
  }
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < length) {
    uVar9 = 0;
    do {
      pbVar8 = local_178.
               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158 = uVar9;
      if (0x20 < (ulong)((long)local_178.
                               super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar9].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8)) {
        uVar17 = 1;
        do {
          pcVar5 = pbVar8[uVar17]._M_dataplus._M_p;
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,pcVar5,pcVar5 + pbVar8[uVar17]._M_string_length);
          public_tool::parse_elem(&local_128,&local_1b8);
          local_150 = uVar17;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p);
          }
          local_1f8._0_8_ = (pointer)0x0;
          local_1f8._8_8_ = (pointer)0x0;
          local_1f8._16_8_ = (pointer)0x0;
          if (local_1b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_1b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar14 = 8;
            uVar17 = 0;
            do {
              lVar16 = *(long *)((long)local_1b8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar14 + -8);
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a8,lVar16,
                         *(long *)((long)&((local_1b8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar14) + lVar16);
              iVar7 = find_name(this,&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p);
              }
              local_198._M_dataplus._M_p._0_4_ = iVar7;
              if (iVar7 == -2) {
                local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                lVar16 = *(long *)((long)local_1b8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar14 + -8);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_148,lVar16,
                           *(long *)((long)&((local_1b8.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar14) + lVar16);
                local_198._M_dataplus._M_p._0_4_ = add_element(this,&local_148,true);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._M_dataplus._M_p != &local_148.field_2) {
                  operator_delete(local_148._M_dataplus._M_p);
                }
              }
              if (local_1f8._8_8_ == local_1f8._16_8_) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)local_1f8,(iterator)local_1f8._8_8_,
                           (int *)&local_198);
              }
              else {
                *(int *)local_1f8._8_8_ = (int)local_198._M_dataplus._M_p;
                local_1f8._8_8_ = local_1f8._8_8_ + 4;
              }
              uVar17 = uVar17 + 1;
              lVar14 = lVar14 + 0x20;
            } while (uVar17 < (ulong)((long)local_1b8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_1b8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          pbVar8 = local_178.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar5 = (pbVar8->_M_dataplus)._M_p;
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar5,pcVar5 + pbVar8->_M_string_length);
          iVar7 = find_name(this,&local_c8);
          pEVar10 = (pvVar2->
                    super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
          base_grammar::Express::Express(&local_48,(vector<int,_std::allocator<int>_> *)local_1f8);
          std::vector<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>::push_back
                    (&pEVar10[iVar7].expression_of_set,(value_type *)&local_48);
          if (local_48.expression.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.expression.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          uVar17 = local_150;
          if ((pointer)local_1f8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_1f8._0_8_);
          }
          uVar17 = uVar17 + 1;
          pbVar8 = local_178.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar17 < (ulong)((long)local_178.
                                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar9].
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >>
                                 5));
      }
      uVar9 = local_158 + 1;
    } while (uVar9 != local_1d0);
  }
  clear_left_recursion(this);
  clear_left_factor(this);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"#","");
  add_element(this,&local_e8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_1f8._0_8_ = local_1f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"finnaly:","");
  pEVar10 = (this->elements).
            super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->elements).
      super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar10) {
    uVar9 = 0;
    do {
      if (pEVar10[uVar9].super_Elem.is_finally == false) {
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pEVar10[uVar9].super_Elem.name._M_dataplus._M_p,
                             pEVar10[uVar9].super_Elem.name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"->",2);
        pEVar10 = (pvVar2->
                  super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pEVar10[uVar9].expression_of_set.
                     super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>
                     ._M_impl + 8) !=
            pEVar10[uVar9].expression_of_set.
            super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar17 = 0;
          do {
            pEVar10 = (pvVar2->
                      super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar14 = *(long *)&pEVar10[uVar9].expression_of_set.
                               super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>
                               ._M_impl.super__Vector_impl_data;
            lVar16 = *(long *)(lVar14 + uVar17 * 0x18);
            if (*(long *)(lVar14 + 8 + uVar17 * 0x18) != lVar16) {
              uVar13 = 0;
              do {
                lVar14 = (long)*(int *)(lVar16 + uVar13 * 4);
                if (lVar14 == -1) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"@",1);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pEVar10[lVar14].super_Elem.name._M_dataplus._M_p,
                             pEVar10[lVar14].super_Elem.name._M_string_length);
                }
                uVar13 = uVar13 + 1;
                pEVar10 = (pvVar2->
                          super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                lVar14 = *(long *)&pEVar10[uVar9].expression_of_set.
                                   super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>
                                   ._M_impl.super__Vector_impl_data;
                lVar16 = *(long *)(lVar14 + uVar17 * 0x18);
              } while (uVar13 < (ulong)(*(long *)(lVar14 + 8 + uVar17 * 0x18) - lVar16 >> 2));
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
            pEVar10 = (pvVar2->
                      super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar17 = uVar17 + 1;
            uVar13 = ((long)*(pointer *)
                             ((long)&pEVar10[uVar9].expression_of_set.
                                     super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>
                                     ._M_impl + 8) -
                      *(long *)&pEVar10[uVar9].expression_of_set.
                                super__Vector_base<ll_grammar::ExpressLeft,_std::allocator<ll_grammar::ExpressLeft>_>
                                ._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555;
          } while (uVar17 <= uVar13 && uVar13 - uVar17 != 0);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
      }
      else {
        std::operator+(&local_198," ",&pEVar10[uVar9].super_Elem.name);
        std::__cxx11::string::_M_append
                  (local_1f8,
                   CONCAT44(local_198._M_dataplus._M_p._4_4_,(int)local_198._M_dataplus._M_p));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_198._M_dataplus._M_p._4_4_,(int)local_198._M_dataplus._M_p) !=
            &local_198.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_198._M_dataplus._M_p._4_4_,(int)local_198._M_dataplus._M_p)
                         );
        }
      }
      uVar9 = uVar9 + 1;
      pEVar10 = (this->elements).
                super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar17 = ((long)(this->elements).
                      super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar10 >> 3) *
               -0x71c71c71c71c71c7;
    } while (uVar9 <= uVar17 && uVar17 - uVar9 != 0);
  }
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_1f8._0_8_,local_1f8._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  get_tow_char_index(this);
  create_first_set(this);
  if ((this->elements).
      super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->elements).
      super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"first[",6);
      pEVar10 = (pvVar2->
                super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>).
                _M_impl.super__Vector_impl_data._M_start;
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pEVar10[uVar9].super_Elem.name._M_dataplus._M_p,
                           pEVar10[uVar9].super_Elem.name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]={",3);
      pvVar6 = (local_1c0->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar12 = pvVar6[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar6[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data + 8) != piVar12) {
        uVar17 = 0;
        do {
          lVar14 = (long)piVar12[uVar17];
          if (lVar14 == -1) {
            lVar14 = 2;
            poVar11 = (ostream *)&std::cout;
            pcVar15 = "@ ";
          }
          else {
            pEVar10 = (pvVar2->
                      super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 pEVar10[lVar14].super_Elem.name._M_dataplus._M_p,
                                 pEVar10[lVar14].super_Elem.name._M_string_length);
            lVar14 = 1;
            pcVar15 = " ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar15,lVar14);
          uVar17 = uVar17 + 1;
          pvVar6 = (local_1c0->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar12 = pvVar6[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar17 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar6[uVar9].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data + 8) -
                                  (long)piVar12 >> 2));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\n",2);
      uVar9 = uVar9 + 1;
      uVar17 = ((long)(this->elements).
                      super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->elements).
                      super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
    } while (uVar9 <= uVar17 && uVar17 - uVar9 != 0);
  }
  this_00 = (local_1d8->
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"#","");
  local_198._M_dataplus._M_p._0_4_ = find_name(this,&local_108);
  __position._M_current =
       (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (this_00,__position,(int *)&local_198);
  }
  else {
    *__position._M_current = (int)local_198._M_dataplus._M_p;
    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  create_follow_set(this);
  pEVar10 = (this->elements).
            super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->elements).
      super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar10) {
    uVar9 = 0;
    do {
      if (pEVar10[uVar9].super_Elem.is_finally == false) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"follow[",7);
        pEVar10 = (pvVar2->
                  super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pEVar10[uVar9].super_Elem.name._M_dataplus._M_p,
                             pEVar10[uVar9].super_Elem.name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]={",3);
        pvVar6 = (local_1d8->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        piVar12 = *(pointer *)&pvVar6[uVar9].super__Vector_base<int,_std::allocator<int>_>;
        if (*(pointer *)((long)(pvVar6 + uVar9) + 8) != piVar12) {
          uVar17 = 0;
          do {
            lVar14 = (long)piVar12[uVar17];
            if (lVar14 == -1) {
              lVar14 = 2;
              poVar11 = (ostream *)&std::cout;
              pcVar15 = "@ ";
            }
            else {
              pEVar10 = (pvVar2->
                        super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   pEVar10[lVar14].super_Elem.name._M_dataplus._M_p,
                                   pEVar10[lVar14].super_Elem.name._M_string_length);
              lVar14 = 1;
              pcVar15 = " ";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar15,lVar14);
            uVar17 = uVar17 + 1;
            pvVar6 = (local_1d8->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            piVar12 = *(pointer *)&pvVar6[uVar9].super__Vector_base<int,_std::allocator<int>_>;
          } while (uVar17 < (ulong)((long)*(pointer *)((long)(pvVar6 + uVar9) + 8) - (long)piVar12
                                   >> 2));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\n",2);
      }
      uVar9 = uVar9 + 1;
      pEVar10 = (this->elements).
                super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar17 = ((long)(this->elements).
                      super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar10 >> 3) *
               -0x71c71c71c71c71c7;
    } while (uVar9 <= uVar17 && uVar17 - uVar9 != 0);
  }
  get_predict_table(this);
  if ((this->predict_table).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->predict_table).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      pvVar6 = (local_1c8->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar12 = pvVar6[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar6[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data + 8) != piVar12) {
        uVar17 = 0;
        do {
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar12[uVar17]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          uVar17 = uVar17 + 1;
          pvVar6 = (local_1c8->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar12 = pvVar6[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar17 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar6[uVar9].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data + 8) -
                                  (long)piVar12 >> 2));
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      uVar9 = uVar9 + 1;
      uVar17 = ((long)(this->predict_table).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->predict_table).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar9 <= uVar17 && uVar17 - uVar9 != 0);
  }
  if ((pointer)local_1f8._0_8_ != (pointer)(local_1f8 + 0x10)) {
    operator_delete((void *)local_1f8._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_178);
  return;
}

Assistant:

GrammarLeft::GrammarLeft(string* generate, int length){
    //1.解析所有字符串
    vector<vector<string>> vectorGenrates;//这个是用来存放各个表达式

    //解析各个表达式,第一个是非终结符号，后面的是产生式
    for (int i = 0; i < length; i++){
        vector<string> temp;
        parse_productions(generate[i], temp);
        vectorGenrates.push_back(temp);
    }

    //2.添加非终结符添加到find表中,开始的非终结符就是length个
    for (int i = 0; i < length; i++){
        add_element(vectorGenrates[i][0], false);
    }

    //3.一个个解析产生式,会添加到find表中
    vector<string> result_of_name;
    for (int i = 0; i < length; i++){
        //ElemLeft N_F_E = elements[find_name(vectorGenrates[i][0])];//非终结符，接下来要对这个终结符进行exp的添加
        //对genrates[i]进行分析；
        for (int j = 1; j < vectorGenrates[i].size(); j++){
            parse_elem(vectorGenrates[i][j], result_of_name);
            vector<int> exp;
            for (int m = 0; m < result_of_name.size(); m++){
                int index = find_name(result_of_name[m]);
                if (index == -2){
                    index = add_element(result_of_name[m], true);
                }
                exp.push_back(index);

            }
            elements[find_name(vectorGenrates[i][0])].add_expression(ExpressLeft(exp));
        }
    }

    //4.消除左递归
    this->clear_left_recursion();
    //5.消除左因子
    this->clear_left_factor();

    add_element("#", true);
    //查看输入是不正确
    //测试一下：
    string finnalyC = "finnaly:";
    for (int i = 0; i < elements.size(); i++){
        if (!elements[i].is_finally){
            cout << elements[i].name << "->";
            for (int j = 0; j < elements[i].expression_of_set.size(); j++){
                for (int m = 0; m < elements[i].expression_of_set[j].expression.size(); m++){
                    if (elements[i].expression_of_set[j].expression[m] != -1){
                        cout << elements[elements[i].expression_of_set[j].expression[m]].name;
                    }
                    else
                    {
                        cout << "@";
                    }
                }
                cout << " | ";
            }
            cout << endl;
        }
        else
        {
            finnalyC += " " + elements[i].name;
        }
    }
    cout << finnalyC << endl;

    //6.两表生成（在5的时候就不会再添加新的符号了）
    //同时在这里初始化一下First和Follw表
    get_tow_char_index();

    //7.求first集合
    this->create_first_set();

    //检查一下，first集合
    for (int i = 0; i < elements.size(); i++){
        cout << "first[" << elements[i].name << "]={";
        for (int j = 0; j < first[i].size(); j++){
            if (first[i][j] == -1) cout << "@ ";
            else
            {
                cout << elements[first[i][j]].name << " ";
            }
        }
        cout << "}\n";
    }

    //8.求follow集合
    //将#送到开始符号
    this->follow[0].push_back(find_name("#"));
    this->create_follow_set();


    for (int i = 0; i < elements.size(); i++){

        if (elements[i].is_finally) continue;

        cout << "follow[" << elements[i].name << "]={";
        for (int j = 0; j < follow[i].size(); j++){
            if (follow[i][j] == -1) cout << "@ ";
            else
            {
                cout << elements[follow[i][j]].name << " ";
            }
        }
        cout << "}\n";
    }
    //9.构造预测分析表
    this->get_predict_table();


    for (int i = 0; i < predict_table.size(); i++){
        for (int j = 0; j < predict_table[i].size(); j++){
            cout << predict_table[i][j] << " ";
        }
        cout << endl;
    }

}